

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling.cpp
# Opt level: O0

int __thiscall ncnn::Pooling::forward(Pooling *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar10;
  float val_2;
  int k_1;
  float sum_3;
  float *sptr_1;
  int j_5;
  int i_7;
  float *outptr_4;
  Mat m_12;
  int q_6;
  float val_1;
  int sx;
  int kj;
  int sy;
  int ki;
  int area;
  float sum_2;
  int sx0;
  int j_4;
  int sy0;
  int i_6;
  float *outptr_3;
  Mat m_9;
  int q_5;
  int htailpad;
  int wtailpad;
  float val;
  int k;
  float max_2;
  float *sptr;
  int j_3;
  int i_5;
  float *outptr_2;
  Mat m_6;
  int q_4;
  int j_2;
  int i_4;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outh;
  int outw;
  Mat bottom_blob_bordered;
  int iw_1;
  int ih_1;
  float sum_1;
  int wk;
  int iw1_1;
  int iw0_1;
  int j_1;
  int hk;
  int ih1_1;
  int ih0_1;
  int i_3;
  float *outptr_1;
  float *inptr_1;
  int q_3;
  int iw;
  int ih;
  float max_1;
  int iw1;
  int iw0;
  int j;
  int ih1;
  int ih0;
  int i_2;
  float *outptr;
  float *inptr;
  int q_2;
  int _out_h;
  int _out_w;
  int i_1;
  float sum;
  float *ptr_1;
  int q_1;
  int i;
  float max;
  float *ptr;
  int q;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  Mat *m_4;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Mat *m_14;
  Mat *m_13;
  Mat *m_11;
  Mat *m_10;
  Mat *m_8;
  Mat *m_7;
  Mat *m_5;
  Mat *m_3;
  Allocator *in_stack_ffffffffffffeda8;
  void **ppvVar11;
  allocator_type *in_stack_ffffffffffffedb0;
  size_type in_stack_ffffffffffffedb8;
  Mat *in_stack_ffffffffffffedc0;
  undefined8 in_stack_ffffffffffffedc8;
  Mat *in_stack_ffffffffffffedd0;
  bool local_1119;
  Option *in_stack_ffffffffffffef10;
  Mat *in_stack_ffffffffffffef18;
  Mat *in_stack_ffffffffffffef20;
  Pooling *in_stack_ffffffffffffef28;
  int local_1050;
  int local_104c;
  int local_fd8;
  float local_fd4;
  int local_fc8;
  int local_fc4;
  undefined8 local_fc0;
  undefined8 local_fb8;
  undefined8 local_fb0;
  undefined4 local_fa8;
  long local_fa0;
  undefined4 local_f98;
  undefined4 local_f94;
  undefined4 local_f90;
  undefined4 local_f8c;
  undefined4 local_f88;
  undefined8 local_f80;
  long local_f78;
  undefined8 local_f70;
  undefined8 local_f68;
  undefined8 local_f60;
  undefined4 local_f58;
  long *local_f50;
  undefined4 local_f48;
  undefined4 local_f44;
  undefined4 local_f40;
  undefined4 local_f3c;
  undefined4 local_f38;
  undefined8 local_f30;
  int local_f28;
  float local_f24;
  int local_f20;
  int local_f1c;
  int local_f18;
  int local_f14;
  int local_f10;
  float local_f0c;
  int local_f08;
  int local_f04;
  int local_f00;
  int local_efc;
  undefined8 local_ef8;
  undefined8 local_ef0;
  undefined8 local_ee8;
  undefined4 local_ee0;
  long local_ed8;
  undefined4 local_ed0;
  undefined4 local_ecc;
  undefined4 local_ec8;
  undefined4 local_ec4;
  undefined4 local_ec0;
  undefined8 local_eb8;
  long local_eb0;
  undefined8 local_ea8;
  undefined8 local_ea0;
  undefined8 local_e98;
  undefined4 local_e90;
  long *local_e88;
  undefined4 local_e80;
  undefined4 local_e7c;
  undefined4 local_e78;
  undefined4 local_e74;
  undefined4 local_e70;
  undefined8 local_e68;
  int local_e60;
  int local_e5c;
  int local_e58;
  float local_e54;
  int local_e50;
  float local_e4c;
  float *local_e48;
  int local_e40;
  int local_e3c;
  undefined8 local_e38;
  undefined8 local_e30;
  undefined8 local_e28;
  undefined4 local_e20;
  long local_e18;
  undefined4 local_e10;
  undefined4 local_e0c;
  undefined4 local_e08;
  undefined4 local_e04;
  undefined4 local_e00;
  undefined8 local_df8;
  long local_df0;
  void *local_de8;
  int *local_de0;
  ulong local_dd8;
  undefined4 local_dd0;
  long *local_dc8;
  int local_dc0;
  int local_dbc;
  int local_db8;
  undefined4 local_db4;
  undefined4 local_db0;
  ulong local_da8;
  int local_da0;
  int local_d9c;
  int local_d98;
  int local_d94;
  int local_d90;
  int local_d8c;
  reference local_d88;
  vector<int,_std::allocator<int>_> local_d78;
  int local_d60;
  int local_d5c;
  int local_d58;
  undefined4 local_d54;
  void *local_d50;
  int *local_d48;
  ulong local_d40;
  undefined4 local_d38;
  long *local_d30;
  int local_d28;
  int local_d24;
  int local_d20;
  undefined4 local_d1c;
  int local_d18;
  long local_d10;
  int local_d04;
  int local_d00;
  float local_cfc;
  int local_cec;
  int local_cdc;
  long local_c90;
  int local_c38;
  int local_c34;
  int local_c30;
  float local_c2c;
  int local_c28;
  int local_c24;
  int local_c20;
  int local_c1c;
  int local_c18;
  int local_c14;
  undefined8 local_c10;
  undefined8 local_c08;
  undefined8 local_c00;
  undefined4 local_bf8;
  long local_bf0;
  undefined4 local_be8;
  undefined4 local_be4;
  undefined4 local_be0;
  undefined4 local_bdc;
  undefined4 local_bd8;
  undefined8 local_bd0;
  long local_bc8;
  undefined8 local_bc0;
  undefined8 local_bb8;
  undefined8 local_bb0;
  undefined4 local_ba8;
  long local_ba0;
  undefined4 local_b98;
  undefined4 local_b94;
  undefined4 local_b90;
  undefined4 local_b8c;
  undefined4 local_b88;
  undefined8 local_b80;
  long local_b78;
  int local_b6c;
  int local_b68;
  int local_b64;
  int local_b60;
  float local_b5c;
  int local_b08;
  int local_b04;
  float local_b00 [4];
  undefined8 local_af0;
  undefined8 local_ae8;
  undefined8 local_ae0;
  undefined4 local_ad8;
  long local_ad0;
  undefined4 local_ac8;
  undefined4 local_ac4;
  undefined4 local_ac0;
  undefined4 local_abc;
  undefined4 local_ab8;
  undefined8 local_ab0;
  float *local_aa8;
  int local_aa0;
  int local_a9c;
  long local_a98;
  int local_a8c;
  int local_a88;
  int local_a84;
  long *local_a78;
  long *local_a70;
  int local_a5c;
  long *local_a58;
  void **local_a50;
  long *local_a48;
  long *local_a40;
  undefined1 local_a1d;
  int local_a1c;
  undefined8 *local_a10;
  undefined1 local_9ed;
  int local_9ec;
  undefined8 *local_9e0;
  undefined8 *local_9d0;
  undefined8 *local_9c0;
  undefined8 *local_998;
  undefined8 *local_978;
  undefined8 *local_968;
  undefined8 *local_938;
  void **local_928;
  undefined8 *local_918;
  undefined8 *local_908;
  undefined8 *local_8f8;
  allocator_type *local_8e8;
  void **local_8d8;
  long local_8b8;
  int local_8a8;
  undefined4 local_8a4;
  long *local_8a0;
  undefined1 local_885;
  int local_884;
  undefined8 *local_878;
  undefined1 local_865;
  int local_864;
  void **local_860;
  undefined8 *local_858;
  undefined1 local_845;
  int local_844;
  undefined8 *local_838;
  undefined1 local_825;
  int local_824;
  void **local_820;
  undefined8 *local_818;
  undefined1 local_805;
  int local_804;
  undefined8 *local_7f8;
  undefined1 local_7e5;
  int local_7e4;
  void **local_7e0;
  void **local_7d8;
  undefined1 local_7a5;
  int local_7a4;
  undefined8 *local_798;
  undefined8 *local_788;
  undefined8 *local_780;
  undefined8 *local_778;
  undefined8 *local_768;
  void **local_760;
  int local_754;
  undefined8 *local_750;
  int local_744;
  undefined8 *local_740;
  int local_734;
  void **local_730;
  long *local_728;
  long *local_720;
  void **local_718;
  long *local_710;
  long local_708;
  undefined4 local_6fc;
  long local_6f8;
  long local_6f0;
  undefined4 local_6e4;
  int local_6e0;
  int local_6dc;
  undefined8 *local_6d8;
  long *local_698;
  undefined4 local_68c;
  ulong local_688;
  void *local_680;
  undefined4 local_674;
  void **local_668;
  long local_660;
  undefined4 local_654;
  long local_650;
  long local_648;
  undefined4 local_63c;
  int local_638;
  int local_634;
  undefined8 *local_630;
  long *local_628;
  undefined4 local_61c;
  ulong local_618;
  void *local_610;
  undefined4 local_604;
  undefined8 *local_5f8;
  long local_5f0;
  undefined4 local_5e4;
  long local_5e0;
  long local_5d8;
  undefined4 local_5cc;
  int local_5c8;
  int local_5c4;
  undefined8 *local_5c0;
  long *local_5b8;
  undefined4 local_5ac;
  ulong local_5a8;
  void *local_5a0;
  undefined4 local_594;
  undefined8 *local_588;
  long local_580;
  undefined4 local_574;
  long local_570;
  long local_568;
  undefined4 local_55c;
  int local_558;
  int local_554;
  undefined8 *local_550;
  long local_548;
  undefined4 local_53c;
  long local_538;
  float *local_530;
  undefined4 local_524;
  int local_520;
  int local_51c;
  undefined8 *local_518;
  long local_4d8;
  undefined4 local_4cc;
  long local_4c8;
  long local_4c0;
  undefined4 local_4b4;
  int local_4b0;
  int local_4ac;
  undefined8 *local_4a8;
  undefined4 local_454;
  long local_450;
  undefined4 local_434;
  long local_430;
  undefined4 local_424;
  long local_420;
  undefined4 local_414;
  long local_410;
  undefined4 local_404;
  long local_400;
  undefined4 local_3f4;
  long local_3f0;
  undefined4 local_3e4;
  long local_3e0;
  undefined4 local_3d4;
  long local_3d0;
  undefined4 local_3b4;
  long local_3b0;
  int local_328;
  undefined4 local_324;
  int local_308;
  undefined4 local_304;
  void **local_300;
  allocator_type *local_2e0;
  undefined8 *local_2c0;
  undefined8 *local_2a0;
  undefined8 *local_280;
  int local_268;
  undefined4 local_264;
  void **local_260;
  undefined8 *local_240;
  undefined8 *local_1e0;
  undefined8 *local_1c0;
  undefined8 *local_180;
  void *local_a8;
  void *local_58;
  void *local_48;
  
  local_a84 = *(int *)((long)in_RSI + 0x2c);
  local_a88 = (int)in_RSI[6];
  local_a8c = (int)in_RSI[7];
  local_a98 = in_RSI[2];
  local_a78 = in_RDX;
  local_a70 = in_RSI;
  if (*(int *)(in_RDI + 0xf4) == 0) {
    if (*(int *)(in_RDI + 0x100) == 0) {
      local_760 = &local_d50;
      local_d50 = (void *)0x0;
      local_d48 = (int *)0x0;
      local_d40 = 0;
      local_d38 = 0;
      local_d30 = (long *)0x0;
      local_d28 = 0;
      local_d24 = 0;
      local_d20 = 0;
      local_d1c = 0;
      local_d18 = 0;
      local_d10 = 0;
      make_padding(in_stack_ffffffffffffef28,in_stack_ffffffffffffef20,in_stack_ffffffffffffef18,
                   in_stack_ffffffffffffef10);
      local_a50 = &local_d50;
      if (local_d50 != (void *)0x0) {
        local_718 = local_a50;
      }
      local_1119 = local_d50 != (void *)0x0 && local_d10 * local_d18 != 0;
      if (local_1119) {
        local_a84 = local_d24;
        local_a88 = local_d20;
        local_d58 = (local_d24 - *(int *)(in_RDI + 0xd4)) / *(int *)(in_RDI + 0xdc) + 1;
        local_d5c = (local_d20 - *(int *)(in_RDI + 0xd8)) / *(int *)(in_RDI + 0xe0) + 1;
        Mat::create(in_stack_ffffffffffffedd0,(int)((ulong)in_stack_ffffffffffffedc8 >> 0x20),
                    (int)in_stack_ffffffffffffedc8,(int)((ulong)in_stack_ffffffffffffedc0 >> 0x20),
                    in_stack_ffffffffffffedb8,(Allocator *)in_stack_ffffffffffffedb0);
        local_a58 = local_a78;
        bVar10 = true;
        if (*local_a78 != 0) {
          local_710 = local_a78;
          bVar10 = local_a78[8] * (long)(int)local_a78[7] == 0;
        }
        if (bVar10) {
          local_a5c = -100;
          local_d54 = 1;
        }
        else {
          local_d60 = *(int *)(in_RDI + 0xd4) * *(int *)(in_RDI + 0xd8);
          std::allocator<int>::allocator((allocator<int> *)0xf1702a);
          std::vector<int,_std::allocator<int>_>::vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffedc0,
                     in_stack_ffffffffffffedb8,in_stack_ffffffffffffedb0);
          std::allocator<int>::~allocator((allocator<int> *)0xf17056);
          local_d88 = std::vector<int,_std::allocator<int>_>::operator[](&local_d78,0);
          local_d8c = 0;
          local_d90 = 0;
          local_d94 = local_a84 - *(int *)(in_RDI + 0xd4);
          for (local_d98 = 0; local_d98 < *(int *)(in_RDI + 0xd8); local_d98 = local_d98 + 1) {
            for (local_d9c = 0; local_d9c < *(int *)(in_RDI + 0xd4); local_d9c = local_d9c + 1) {
              local_d88[local_d8c] = local_d90;
              local_d8c = local_d8c + 1;
              local_d90 = local_d90 + 1;
            }
            local_d90 = local_d94 + local_d90;
          }
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_da0 = 0; local_da0 < local_a8c; local_da0 = local_da0 + 1) {
              local_7d8 = &local_de8;
              local_7e0 = &local_d50;
              local_680 = (void *)((long)local_d50 + local_d10 * local_da0 * local_d40);
              local_668 = &local_de8;
              local_3d0 = (long)local_d24 * (long)local_d20 * local_d40;
              local_da8 = (local_3d0 + 0xfU & 0xfffffffffffffff0) / local_d40;
              local_dc0 = local_d28 + -1;
              if (local_d28 == 4) {
                local_da8 = (long)local_d24 * (long)local_d20;
              }
              local_7f8 = &local_e38;
              local_634 = *(int *)((long)local_a78 + 0x2c);
              local_638 = (int)local_a78[6];
              local_63c = *(undefined4 *)((long)local_a78 + 0x34);
              local_df0 = *local_a78 + local_a78[8] * (long)local_da0 * local_a78[2];
              local_650 = local_a78[2];
              local_654 = (undefined4)local_a78[3];
              local_660 = local_a78[4];
              local_630 = &local_e38;
              local_3e0 = (long)local_634 * (long)local_638 * local_650;
              local_778 = &local_e38;
              local_938 = &local_e38;
              local_db0 = local_d1c;
              local_db4 = 1;
              local_db8 = local_d20;
              local_dbc = local_d24;
              local_dc8 = local_d30;
              local_dd0 = local_d38;
              local_dd8 = local_d40;
              local_de0 = (int *)0x0;
              local_3d4 = 0x10;
              local_3e4 = 0x10;
              local_674 = local_d1c;
              local_688 = local_d40;
              local_68c = local_d38;
              local_698 = local_d30;
              local_7e4 = local_da0;
              local_7e5 = 1;
              local_804 = local_da0;
              local_805 = 1;
              local_e38 = 0;
              local_e28 = 0;
              local_e20 = 0;
              local_e10 = 0;
              local_e0c = 0;
              local_e08 = 0;
              local_e04 = 0;
              local_e00 = 0;
              local_df8 = 0;
              local_e30 = 0;
              local_648 = local_df0;
              local_240 = local_938;
              local_e18 = local_660;
              local_de8 = local_680;
              for (local_e3c = 0; local_e3c < local_d5c; local_e3c = local_e3c + 1) {
                for (local_e40 = 0; local_e40 < local_d58; local_e40 = local_e40 + 1) {
                  local_734 = local_e3c * *(int *)(in_RDI + 0xe0);
                  local_730 = &local_de8;
                  local_e48 = (float *)((long)local_de8 +
                                       (long)(local_e40 * *(int *)(in_RDI + 0xdc)) * 4 +
                                       (long)local_dbc * (long)local_734 * local_dd8);
                  local_e4c = *local_e48;
                  for (local_e50 = 0; local_e50 < local_d60; local_e50 = local_e50 + 1) {
                    local_e54 = local_e48[local_d88[local_e50]];
                    pfVar9 = std::max<float>(&local_e4c,&local_e54);
                    local_e4c = *pfVar9;
                  }
                  *(float *)(local_df0 + (long)local_e40 * 4) = local_e4c;
                }
                local_df0 = local_df0 + (long)local_d58 * 4;
              }
              local_928 = &local_de8;
              local_260 = local_928;
              if (local_de0 != (int *)0x0) {
                local_264 = 0xffffffff;
                LOCK();
                local_268 = *local_de0;
                *local_de0 = *local_de0 + -1;
                UNLOCK();
                if (local_268 == 1) {
                  if (local_dc8 == (long *)0x0) {
                    local_a8 = local_de8;
                    if (local_de8 != (void *)0x0) {
                      free(local_de8);
                    }
                  }
                  else {
                    (**(code **)(*local_dc8 + 0x18))(local_dc8,local_de8);
                  }
                }
              }
              local_de8 = (void *)0x0;
              local_dd8 = 0;
              local_dd0 = 0;
              local_dc0 = 0;
              local_dbc = 0;
              local_db8 = 0;
              local_db4 = 0;
              local_db0 = 0;
              local_da8 = 0;
              local_de0 = (int *)0x0;
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            if (*(int *)(in_RDI + 0xfc) == 0) {
              local_e58 = 0;
              local_e5c = 0;
              if (*(int *)(in_RDI + 0xf8) == 0) {
                local_e58 = ((local_d24 - *(int *)((long)local_a70 + 0x2c)) -
                            *(int *)(in_RDI + 0xe4)) - *(int *)(in_RDI + 0xe8);
                local_e5c = ((local_d20 - (int)local_a70[6]) - *(int *)(in_RDI + 0xec)) -
                            *(int *)(in_RDI + 0xf0);
              }
              for (local_e60 = 0; local_e60 < local_a8c; local_e60 = local_e60 + 1) {
                local_818 = &local_ea8;
                local_820 = &local_d50;
                local_610 = (void *)((long)local_d50 + local_d10 * local_e60 * local_d40);
                local_5f8 = &local_ea8;
                local_3f0 = (long)local_d24 * (long)local_d20 * local_d40;
                local_838 = &local_ef8;
                local_5c4 = *(int *)((long)local_a78 + 0x2c);
                local_5c8 = (int)local_a78[6];
                local_5cc = *(undefined4 *)((long)local_a78 + 0x34);
                local_5d8 = *local_a78 + local_a78[8] * (long)local_e60 * local_a78[2];
                local_5e0 = local_a78[2];
                local_5e4 = (undefined4)local_a78[3];
                local_5f0 = local_a78[4];
                local_5c0 = &local_ef8;
                local_400 = (long)local_5c4 * (long)local_5c8 * local_5e0;
                local_780 = &local_ef8;
                local_918 = &local_ef8;
                local_e88 = local_d30;
                local_3f4 = 0x10;
                local_404 = 0x10;
                local_604 = local_d1c;
                local_618 = local_d40;
                local_61c = local_d38;
                local_628 = local_d30;
                local_824 = local_e60;
                local_825 = 1;
                local_844 = local_e60;
                local_845 = 1;
                local_ef8 = 0;
                local_ee8 = 0;
                local_ee0 = 0;
                local_ed0 = 0;
                local_ecc = 0;
                local_ec8 = 0;
                local_ec4 = 0;
                local_ec0 = 0;
                local_eb8 = 0;
                local_ef0 = 0;
                local_eb0 = local_5d8;
                for (local_efc = 0; local_efc < local_d5c; local_efc = local_efc + 1) {
                  local_f00 = local_efc * *(int *)(in_RDI + 0xe0);
                  for (local_f04 = 0; local_f04 < local_d58; local_f04 = local_f04 + 1) {
                    local_f08 = local_f04 * *(int *)(in_RDI + 0xdc);
                    local_f0c = 0.0;
                    local_f10 = 0;
                    for (local_f14 = 0; local_f14 < *(int *)(in_RDI + 0xd8);
                        local_f14 = local_f14 + 1) {
                      local_f18 = local_f00 + local_f14;
                      if (*(int *)(in_RDI + 0xec) <= local_f18) {
                        if ((local_a88 - *(int *)(in_RDI + 0xf0)) - local_e5c <= local_f18) break;
                        for (local_f1c = 0; local_f1c < *(int *)(in_RDI + 0xd4);
                            local_f1c = local_f1c + 1) {
                          local_f20 = local_f08 + local_f1c;
                          if (*(int *)(in_RDI + 0xe4) <= local_f20) {
                            if ((local_a84 - *(int *)(in_RDI + 0xe8)) - local_e58 <= local_f20)
                            break;
                            local_740 = &local_ea8;
                            local_f24 = *(float *)((long)local_610 +
                                                  (long)local_f20 * 4 +
                                                  (long)local_d24 * (long)local_f18 * local_d40);
                            local_f0c = local_f24 + local_f0c;
                            local_f10 = local_f10 + 1;
                            local_744 = local_f18;
                          }
                        }
                      }
                    }
                    *(float *)(local_eb0 + (long)local_f04 * 4) = local_f0c / (float)local_f10;
                  }
                  local_eb0 = local_eb0 + (long)local_d58 * 4;
                }
                local_908 = &local_ea8;
                local_ea8 = 0;
                local_e98 = 0;
                local_e90 = 0;
                local_e80 = 0;
                local_e7c = 0;
                local_e78 = 0;
                local_e74 = 0;
                local_e70 = 0;
                local_e68 = 0;
                local_ea0 = 0;
                local_2a0 = local_908;
                local_280 = local_918;
                local_ed8 = local_5f0;
              }
            }
            else {
              for (local_f28 = 0; local_f28 < local_a8c; local_f28 = local_f28 + 1) {
                local_858 = &local_f70;
                local_860 = &local_d50;
                local_5a0 = (void *)((long)local_d50 + local_d10 * local_f28 * local_d40);
                local_588 = &local_f70;
                local_410 = (long)local_d24 * (long)local_d20 * local_d40;
                local_878 = &local_fc0;
                local_554 = *(int *)((long)local_a78 + 0x2c);
                local_558 = (int)local_a78[6];
                local_55c = *(undefined4 *)((long)local_a78 + 0x34);
                local_568 = *local_a78 + local_a78[8] * (long)local_f28 * local_a78[2];
                local_570 = local_a78[2];
                local_574 = (undefined4)local_a78[3];
                local_580 = local_a78[4];
                local_550 = &local_fc0;
                local_420 = (long)local_554 * (long)local_558 * local_570;
                local_788 = &local_fc0;
                local_8f8 = &local_fc0;
                local_fc0 = 0;
                local_fb0 = 0;
                local_fa8 = 0;
                local_f98 = 0;
                local_f94 = 0;
                local_f90 = 0;
                local_f8c = 0;
                local_f88 = 0;
                local_f80 = 0;
                local_fb8 = 0;
                local_f78 = local_568;
                for (local_fc4 = 0; local_fc4 < local_d5c; local_fc4 = local_fc4 + 1) {
                  for (local_fc8 = 0; local_fc8 < local_d58; local_fc8 = local_fc8 + 1) {
                    local_754 = local_fc4 * *(int *)(in_RDI + 0xe0);
                    local_750 = &local_f70;
                    local_fd4 = 0.0;
                    for (local_fd8 = 0; local_fd8 < local_d60; local_fd8 = local_fd8 + 1) {
                      local_fd4 = *(float *)((long)local_5a0 +
                                            (long)local_d88[local_fd8] * 4 +
                                            (long)(local_fc8 * *(int *)(in_RDI + 0xdc)) * 4 +
                                            (long)local_d24 * (long)local_754 * local_d40) +
                                  local_fd4;
                    }
                    *(float *)(local_f78 + (long)local_fc8 * 4) = local_fd4 / (float)local_d60;
                  }
                  local_f78 = local_f78 + (long)local_d58 * 4;
                }
                in_stack_ffffffffffffedb0 = (allocator_type *)&local_f70;
                local_f50 = local_d30;
                local_414 = 0x10;
                local_424 = 0x10;
                local_594 = local_d1c;
                local_5a8 = local_d40;
                local_5ac = local_d38;
                local_5b8 = local_d30;
                local_864 = local_f28;
                local_865 = 1;
                local_884 = local_f28;
                local_885 = 1;
                local_f70 = 0;
                local_f60 = 0;
                local_f58 = 0;
                local_f48 = 0;
                local_f44 = 0;
                local_f40 = 0;
                local_f3c = 0;
                local_f38 = 0;
                local_f30 = 0;
                local_f68 = 0;
                local_8e8 = in_stack_ffffffffffffedb0;
                local_2e0 = in_stack_ffffffffffffedb0;
                local_2c0 = local_8f8;
                local_fa0 = local_580;
              }
            }
          }
          local_a5c = 0;
          local_d54 = 1;
          std::vector<int,_std::allocator<int>_>::~vector
                    ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffedb0);
        }
      }
      else {
        local_a5c = -100;
        local_d54 = 1;
      }
      ppvVar11 = &local_d50;
      if (local_d48 != (int *)0x0) {
        local_304 = 0xffffffff;
        LOCK();
        local_308 = *local_d48;
        *local_d48 = *local_d48 + -1;
        UNLOCK();
        if (local_308 == 1) {
          local_8d8 = ppvVar11;
          local_300 = ppvVar11;
          if (local_d30 == (long *)0x0) {
            local_58 = local_d50;
            if (local_d50 != (void *)0x0) {
              free(local_d50);
            }
          }
          else {
            (**(code **)(*local_d30 + 0x18))(local_d30,local_d50);
          }
        }
      }
      *ppvVar11 = (void *)0x0;
      ppvVar11[2] = (void *)0x0;
      *(undefined4 *)(ppvVar11 + 3) = 0;
      *(undefined4 *)(ppvVar11 + 5) = 0;
      *(undefined4 *)((long)ppvVar11 + 0x2c) = 0;
      *(undefined4 *)(ppvVar11 + 6) = 0;
      *(undefined4 *)((long)ppvVar11 + 0x34) = 0;
      *(undefined4 *)(ppvVar11 + 7) = 0;
      ppvVar11[8] = (void *)0x0;
      ppvVar11[1] = (void *)0x0;
    }
    else {
      local_104c = local_a84;
      if (*(int *)(in_RDI + 0x104) != -0xe9) {
        local_104c = *(int *)(in_RDI + 0x104);
      }
      local_b64 = local_104c;
      local_1050 = local_a88;
      if (*(int *)(in_RDI + 0x108) != -0xe9) {
        local_1050 = *(int *)(in_RDI + 0x108);
      }
      local_b68 = local_1050;
      if ((local_104c == local_a84) && (local_1050 == local_a88)) {
        if (in_RDX != in_RSI) {
          if (in_RSI[1] != 0) {
            piVar1 = (int *)in_RSI[1];
            local_8a4 = 1;
            LOCK();
            local_8a8 = *piVar1;
            *piVar1 = *piVar1 + 1;
            UNLOCK();
          }
          local_8a0 = in_RSI;
          if (in_RDX[1] != 0) {
            piVar1 = (int *)in_RDX[1];
            local_324 = 0xffffffff;
            LOCK();
            local_328 = *piVar1;
            *piVar1 = *piVar1 + -1;
            UNLOCK();
            if (local_328 == 1) {
              if (in_RDX[4] == 0) {
                local_48 = (void *)*in_RDX;
                if (local_48 != (void *)0x0) {
                  free(local_48);
                }
              }
              else {
                (**(code **)(*(long *)in_RDX[4] + 0x18))((long *)in_RDX[4],*in_RDX);
              }
            }
          }
          *in_RDX = 0;
          in_RDX[2] = 0;
          *(undefined4 *)(in_RDX + 3) = 0;
          *(undefined4 *)(in_RDX + 5) = 0;
          *(undefined4 *)((long)in_RDX + 0x2c) = 0;
          *(undefined4 *)(in_RDX + 6) = 0;
          *(undefined4 *)((long)in_RDX + 0x34) = 0;
          *(undefined4 *)(in_RDX + 7) = 0;
          in_RDX[8] = 0;
          in_RDX[1] = 0;
          *in_RDX = *local_8a0;
          in_RDX[1] = local_8a0[1];
          in_RDX[2] = local_8a0[2];
          *(int *)(in_RDX + 3) = (int)local_8a0[3];
          in_RDX[4] = local_8a0[4];
          *(int *)(in_RDX + 5) = (int)local_8a0[5];
          *(undefined4 *)((long)in_RDX + 0x2c) = *(undefined4 *)((long)local_8a0 + 0x2c);
          *(int *)(in_RDX + 6) = (int)local_8a0[6];
          *(undefined4 *)((long)in_RDX + 0x34) = *(undefined4 *)((long)local_8a0 + 0x34);
          *(int *)(in_RDX + 7) = (int)local_8a0[7];
          in_RDX[8] = local_8a0[8];
        }
        local_a5c = 0;
      }
      else {
        Mat::create(in_stack_ffffffffffffedd0,(int)((ulong)in_stack_ffffffffffffedc8 >> 0x20),
                    (int)in_stack_ffffffffffffedc8,(int)((ulong)in_stack_ffffffffffffedc0 >> 0x20),
                    in_stack_ffffffffffffedb8,(Allocator *)in_stack_ffffffffffffedb0);
        local_a48 = local_a78;
        bVar10 = true;
        if (*local_a78 != 0) {
          local_720 = local_a78;
          bVar10 = local_a78[8] * (long)(int)local_a78[7] == 0;
        }
        if (bVar10) {
          local_a5c = -100;
        }
        else {
          if (*(int *)(in_RDI + 0xd0) == 0) {
            for (local_b6c = 0; local_b6c < local_a8c; local_b6c = local_b6c + 1) {
              local_a10 = &local_bc0;
              local_4ac = *(int *)((long)local_a70 + 0x2c);
              local_4b0 = (int)local_a70[6];
              local_4b4 = *(undefined4 *)((long)local_a70 + 0x34);
              local_b78 = *local_a70 + local_a70[8] * (long)local_b6c * local_a70[2];
              local_4c8 = local_a70[2];
              local_4cc = (undefined4)local_a70[3];
              local_4d8 = local_a70[4];
              local_4a8 = &local_bc0;
              local_450 = (long)local_4ac * (long)local_4b0 * local_4c8;
              local_9d0 = &local_bc0;
              local_978 = &local_bc0;
              local_798 = &local_c10;
              local_6dc = *(int *)((long)local_a78 + 0x2c);
              local_6e0 = (int)local_a78[6];
              local_6e4 = *(undefined4 *)((long)local_a78 + 0x34);
              local_bc8 = *local_a78 + local_a78[8] * (long)local_b6c * local_a78[2];
              local_6f8 = local_a78[2];
              local_6fc = (undefined4)local_a78[3];
              local_708 = local_a78[4];
              local_6d8 = &local_c10;
              local_3b0 = (long)local_6dc * (long)local_6e0 * local_6f8;
              local_768 = &local_c10;
              local_968 = &local_c10;
              local_b88 = 0;
              local_b8c = 0;
              local_b90 = 0;
              local_b94 = 0;
              local_ba8 = 0;
              local_bb0 = 0;
              local_bb8 = 0;
              local_bc0 = 0;
              local_3b4 = 0x10;
              local_454 = 0x10;
              local_7a4 = local_b6c;
              local_7a5 = 1;
              local_a1c = local_b6c;
              local_a1d = 1;
              local_b80 = 0;
              local_b98 = 0;
              local_c10 = 0;
              local_c00 = 0;
              local_bf8 = 0;
              local_be8 = 0;
              local_be4 = 0;
              local_be0 = 0;
              local_bdc = 0;
              local_bd8 = 0;
              local_bd0 = 0;
              local_c08 = 0;
              local_6f0 = local_bc8;
              local_4c0 = local_b78;
              local_1e0 = local_968;
              local_1c0 = local_978;
              local_bf0 = local_708;
              local_ba0 = local_4d8;
              for (local_c14 = 0; local_c14 < local_b68; local_c14 = local_c14 + 1) {
                local_c18 = (local_a88 * local_c14) / local_b68;
                local_c1c = (local_a88 * (local_c14 + 1) + local_b68 + -1) / local_b68;
                for (local_c20 = 0; local_c20 < local_b64; local_c20 = local_c20 + 1) {
                  local_c24 = (local_a84 * local_c20) / local_b64;
                  local_c28 = (local_a84 * (local_c20 + 1) + local_b64 + -1) / local_b64;
                  local_c2c = *(float *)(local_b78 + (long)(local_c18 * local_a84 + local_c24) * 4);
                  for (local_c30 = local_c18; local_c30 < local_c1c; local_c30 = local_c30 + 1) {
                    for (local_c34 = local_c24; local_c34 < local_c28; local_c34 = local_c34 + 1) {
                      pfVar9 = std::max<float>(&local_c2c,
                                               (float *)(local_b78 +
                                                        (long)(local_c30 * local_a84 + local_c34) *
                                                        4));
                      local_c2c = *pfVar9;
                    }
                  }
                  *(float *)(local_bc8 + (long)local_c20 * 4) = local_c2c;
                }
                local_bc8 = local_bc8 + (long)local_b64 * 4;
              }
            }
          }
          else if (*(int *)(in_RDI + 0xd0) == 1) {
            for (local_c38 = 0; local_c38 < local_a8c; local_c38 = local_c38 + 1) {
              lVar2 = *local_a70;
              lVar3 = local_a70[8];
              lVar4 = local_a70[2];
              local_c90 = *local_a78 + local_a78[8] * (long)local_c38 * local_a78[2];
              for (local_cdc = 0; local_cdc < local_b68; local_cdc = local_cdc + 1) {
                iVar5 = (local_a88 * local_cdc) / local_b68;
                iVar6 = (local_a88 * (local_cdc + 1) + local_b68 + -1) / local_b68;
                for (local_cec = 0; local_cec < local_b64; local_cec = local_cec + 1) {
                  iVar7 = (local_a84 * local_cec) / local_b64;
                  iVar8 = (local_a84 * (local_cec + 1) + local_b64 + -1) / local_b64;
                  local_cfc = 0.0;
                  for (local_d00 = iVar5; local_d04 = iVar7, local_d00 < iVar6;
                      local_d00 = local_d00 + 1) {
                    for (; local_d04 < iVar8; local_d04 = local_d04 + 1) {
                      local_cfc = *(float *)(lVar2 + lVar3 * local_c38 * lVar4 +
                                            (long)(local_d00 * local_a84 + local_d04) * 4) +
                                  local_cfc;
                    }
                  }
                  *(float *)(local_c90 + (long)local_cec * 4) =
                       (local_cfc / (float)(iVar6 - iVar5)) / (float)(iVar8 - iVar7);
                }
                local_c90 = local_c90 + (long)local_b64 * 4;
              }
            }
          }
          local_a5c = 0;
        }
      }
    }
  }
  else {
    Mat::create(in_stack_ffffffffffffedc0,(int)(in_stack_ffffffffffffedb8 >> 0x20),
                (size_t)in_stack_ffffffffffffedb0,in_stack_ffffffffffffeda8);
    local_a40 = local_a78;
    bVar10 = true;
    if (*local_a78 != 0) {
      local_728 = local_a78;
      bVar10 = local_a78[8] * (long)(int)local_a78[7] == 0;
    }
    if (bVar10) {
      local_a5c = -100;
    }
    else {
      local_a9c = local_a84 * local_a88;
      if (*(int *)(in_RDI + 0xd0) == 0) {
        for (local_aa0 = 0; local_aa0 < local_a8c; local_aa0 = local_aa0 + 1) {
          local_9e0 = &local_af0;
          local_51c = *(int *)((long)local_a70 + 0x2c);
          local_520 = (int)local_a70[6];
          local_524 = *(undefined4 *)((long)local_a70 + 0x34);
          local_aa8 = (float *)(*local_a70 + local_a70[8] * (long)local_aa0 * local_a70[2]);
          local_538 = local_a70[2];
          local_53c = (undefined4)local_a70[3];
          local_548 = local_a70[4];
          local_518 = &local_af0;
          local_430 = (long)local_51c * (long)local_520 * local_538;
          local_9c0 = &local_af0;
          local_998 = &local_af0;
          local_434 = 0x10;
          local_9ec = local_aa0;
          local_9ed = 1;
          local_af0 = 0;
          local_ae0 = 0;
          local_ad8 = 0;
          local_ac8 = 0;
          local_ac4 = 0;
          local_ac0 = 0;
          local_abc = 0;
          local_ab8 = 0;
          local_ab0 = 0;
          local_ae8 = 0;
          local_b00[0] = *local_aa8;
          local_530 = local_aa8;
          local_180 = local_998;
          local_ad0 = local_548;
          for (local_b04 = 0; local_b04 < local_a9c; local_b04 = local_b04 + 1) {
            pfVar9 = std::max<float>(local_b00,local_aa8 + local_b04);
            local_b00[0] = *pfVar9;
          }
          local_8b8 = (long)local_aa0;
          *(float *)(*local_a78 + local_8b8 * 4) = local_b00[0];
        }
      }
      else if (*(int *)(in_RDI + 0xd0) == 1) {
        for (local_b08 = 0; local_b08 < local_a8c; local_b08 = local_b08 + 1) {
          local_b5c = 0.0;
          for (local_b60 = 0; local_b60 < local_a9c; local_b60 = local_b60 + 1) {
            local_b5c = *(float *)(*local_a70 + local_a70[8] * (long)local_b08 * local_a70[2] +
                                  (long)local_b60 * 4) + local_b5c;
          }
          *(float *)(*local_a78 + (long)local_b08 * 4) = local_b5c / (float)local_a9c;
        }
      }
      local_a5c = 0;
    }
  }
  return local_a5c;
}

Assistant:

int Pooling::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // max value in NxN window
    // avg value in NxN window

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    //     NCNN_LOGE("Pooling     input %d x %d  pad = %d %d %d %d  ksize=%d %d  stride=%d %d", w, h, pad_left, pad_right, pad_top, pad_bottom, kernel_w, kernel_h, stride_w, stride_h);
    if (global_pooling)
    {
        top_blob.create(channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        int size = w * h;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float max = ptr[0];
                for (int i = 0; i < size; i++)
                {
                    max = std::max(max, ptr[i]);
                }

                top_blob[q] = max;
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);

                float sum = 0.f;
                for (int i = 0; i < size; i++)
                {
                    sum += ptr[i];
                }

                top_blob[q] = sum / size;
            }
        }

        return 0;
    }

    if (adaptive_pooling)
    {
        int _out_w = out_w == -233 ? w : out_w;
        int _out_h = out_h == -233 ? h : out_h;

        if (_out_w == w && _out_h == h)
        {
            top_blob = bottom_blob;
            return 0;
        }

        top_blob.create(_out_w, _out_h, channels, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (pooling_type == PoolMethod_MAX)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < _out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / _out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                    for (int j = 0; j < _out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / _out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;

                        float max = inptr[ih0 * w + iw0];
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                max = std::max(max, inptr[ih * w + iw]);
                            }
                        }

                        outptr[j] = max;
                    }
                    outptr += _out_w;
                }
            }
        }
        else if (pooling_type == PoolMethod_AVE)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* inptr = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < _out_h; i++)
                {
                    // floor div
                    const int ih0 = h * i / _out_h;
                    // ceil div
                    const int ih1 = (h * (i + 1) + _out_h - 1) / _out_h;
                    const int hk = ih1 - ih0;
                    for (int j = 0; j < _out_w; j++)
                    {
                        // floor div
                        const int iw0 = w * j / _out_w;
                        // ceil div
                        const int iw1 = (w * (j + 1) + _out_w - 1) / _out_w;
                        const int wk = iw1 - iw0;

                        float sum = 0;
                        for (int ih = ih0; ih < ih1; ih++)
                        {
                            for (int iw = iw0; iw < iw1; iw++)
                            {
                                sum += inptr[ih * w + iw];
                            }
                        }

                        outptr[j] = sum / hk / wk;
                    }

                    outptr += _out_w;
                }
            }
        }

        return 0;
    }

    Mat bottom_blob_bordered;
    make_padding(bottom_blob, bottom_blob_bordered, opt);
    if (bottom_blob_bordered.empty())
        return -100;

    w = bottom_blob_bordered.w;
    h = bottom_blob_bordered.h;

    int outw = (w - kernel_w) / stride_w + 1;
    int outh = (h - kernel_h) / stride_h + 1;

    top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w - kernel_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2++;
            }
            p2 += gap;
        }
    }

    if (pooling_type == PoolMethod_MAX)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const Mat m = bottom_blob_bordered.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    const float* sptr = m.row(i * stride_h) + j * stride_w;

                    float max = sptr[0];

                    for (int k = 0; k < maxk; k++)
                    {
                        float val = sptr[space_ofs[k]];
                        max = std::max(max, val);
                    }

                    outptr[j] = max;
                }

                outptr += outw;
            }
        }
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        if (avgpool_count_include_pad == 0)
        {
            int wtailpad = 0;
            int htailpad = 0;

            if (pad_mode == 0) // full padding
            {
                wtailpad = bottom_blob_bordered.w - bottom_blob.w - pad_left - pad_right;
                htailpad = bottom_blob_bordered.h - bottom_blob.h - pad_top - pad_bottom;
            }

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    int sy0 = i * stride_h;

                    for (int j = 0; j < outw; j++)
                    {
                        int sx0 = j * stride_w;

                        float sum = 0;
                        int area = 0;

                        for (int ki = 0; ki < kernel_h; ki++)
                        {
                            int sy = sy0 + ki;

                            if (sy < pad_top)
                                continue;

                            if (sy >= h - pad_bottom - htailpad)
                                break;

                            for (int kj = 0; kj < kernel_w; kj++)
                            {
                                int sx = sx0 + kj;

                                if (sx < pad_left)
                                    continue;

                                if (sx >= w - pad_right - wtailpad)
                                    break;

                                float val = m.row(sy)[sx];
                                sum += val;
                                area += 1;
                            }
                        }

                        outptr[j] = sum / area;
                    }

                    outptr += outw;
                }
            }
        }
        else // if (avgpool_count_include_pad == 1)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat m = bottom_blob_bordered.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        const float* sptr = m.row(i * stride_h) + j * stride_w;

                        float sum = 0;

                        for (int k = 0; k < maxk; k++)
                        {
                            float val = sptr[space_ofs[k]];
                            sum += val;
                        }

                        outptr[j] = sum / maxk;
                    }

                    outptr += outw;
                }
            }
        }
    }

    return 0;
}